

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

_Bool vma_has_flag(unsigned_long vm_start,char *flag)

{
  _Bool _Var1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  FILE *f;
  char **ppcStack_430;
  _Bool found;
  char *tok;
  char buf [1024];
  unsigned_long end;
  unsigned_long start;
  char *flag_local;
  unsigned_long vm_start_local;
  
  end = 0;
  buf[0x3f8] = '\0';
  buf[0x3f9] = '\0';
  buf[0x3fa] = '\0';
  buf[0x3fb] = '\0';
  buf[0x3fc] = '\0';
  buf[0x3fd] = '\0';
  buf[0x3fe] = '\0';
  buf[0x3ff] = '\0';
  ppcStack_430 = (char **)0x0;
  f._7_1_ = false;
  start = (unsigned_long)flag;
  flag_local = (char *)vm_start;
  __stream = fopen("/proc/self/smaps","r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","f != NULL","false",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/slab_arena.c",
            0x2f,"vma_has_flag");
    exit(-1);
  }
  do {
    pcVar3 = fgets((char *)&tok,0x400,__stream);
    if (pcVar3 == (char *)0x0) goto LAB_00101be1;
    _Var1 = is_vma_range_fmt((char *)&tok,&end,(unsigned_long *)(buf + 0x3f8));
  } while (((_Var1) || (iVar2 = strncmp((char *)&tok,"VmFlags: ",9), iVar2 != 0)) ||
          ((char *)end != flag_local));
  ppcStack_430 = &tok;
LAB_00101be1:
  if (ppcStack_430 != (char **)0x0) {
    ppcStack_430 = (char **)strtok((char *)ppcStack_430," \n");
    while (ppcStack_430 != (char **)0x0) {
      iVar2 = strcmp((char *)ppcStack_430,(char *)start);
      if (iVar2 == 0) {
        f._7_1_ = true;
        break;
      }
      ppcStack_430 = (char **)strtok((char *)0x0," \n");
    }
  }
  fclose(__stream);
  return f._7_1_;
}

Assistant:

static bool
vma_has_flag(unsigned long vm_start, const char *flag)
{
	unsigned long start = 0, end = 0;
	char buf[1024], *tok = NULL;
	bool found = false;
	FILE *f = NULL;

	f = fopen("/proc/self/smaps", "r");
	fail_unless(f != NULL);

	while (fgets(buf, sizeof(buf), f)) {
		if (is_vma_range_fmt(buf, &start, &end))
			continue;
		if (strncmp(buf, "VmFlags: ", 9) || start != vm_start)
			continue;
		tok = buf;
		break;
	}

	if (tok) {
		for (tok = strtok(tok, " \n"); tok;
		     tok = strtok(NULL, " \n")) {
			if (strcmp(tok, flag))
				continue;
			found = true;
			break;
		}
	}

	fclose(f);
	return found;
}